

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
check_populate_chunk_count
          (_internal_exr_context *ctxt,_internal_exr_part *curpart,
          _internal_exr_seq_scratch *scratch,char *tname,int32_t attrsz)

{
  exr_result_t eVar1;
  int iVar2;
  exr_result_t eVar3;
  int32_t local_2c;
  
  local_2c = attrsz;
  if (curpart->chunkCount != (exr_attribute_t *)0x0) {
    (*scratch->sequential_skip)(scratch,(long)attrsz);
    eVar1 = (*ctxt->print_error)
                      (ctxt,0xe,"Duplicate copy of required attribute \'chunkCount\' encountered",
                       ctxt->print_error);
    return eVar1;
  }
  iVar2 = strcmp(tname,"int");
  if (iVar2 == 0) {
    if (attrsz == 4) {
      eVar1 = (*scratch->sequential_read)(scratch,&local_2c,4);
      if (eVar1 == 0) {
        eVar1 = 0;
        eVar3 = exr_attr_list_add_static_name
                          ((exr_context_t)ctxt,&curpart->attributes,"chunkCount",EXR_ATTR_INT,0,
                           (uint8_t **)0x0,&curpart->chunkCount);
        if (eVar3 == 0) {
          (curpart->chunkCount->field_6).i = local_2c;
          curpart->chunk_count = local_2c;
        }
        else {
          eVar1 = (*ctxt->print_error)
                            (ctxt,eVar3,"Unable to initialize attribute \'%s\', type \'int\'",
                             "chunkCount");
        }
      }
      else {
        eVar1 = (*ctxt->report_error)(ctxt,eVar1,"Unable to read chunkCount data");
      }
      return eVar1;
    }
    (*scratch->sequential_skip)(scratch,(long)attrsz);
    eVar1 = (*ctxt->print_error)
                      (ctxt,0xe,"Required attribute \'chunkCount\': Invalid size %d (exp 4)",attrsz,
                       ctxt->print_error);
    return eVar1;
  }
  (*scratch->sequential_skip)(scratch,(long)attrsz);
  eVar1 = (*ctxt->print_error)
                    (ctxt,0x10,"attribute \'chunkCount\': Invalid type \'%s\'",tname,
                     ctxt->print_error);
  return eVar1;
}

Assistant:

static exr_result_t
check_populate_chunk_count (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_part*        curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;

    if (curpart->chunkCount)
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Duplicate copy of required attribute 'chunkCount' encountered");
    }

    if (0 != strcmp (tname, "int"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "attribute 'chunkCount': Invalid type '%s'",
            tname);
    }

    if (attrsz != sizeof (int32_t))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Required attribute 'chunkCount': Invalid size %d (exp 4)",
            attrsz);
    }

    rv = scratch->sequential_read (scratch, &attrsz, sizeof (int32_t));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (ctxt, rv, "Unable to read chunkCount data");

    rv = exr_attr_list_add_static_name (
        (exr_context_t) ctxt,
        &(curpart->attributes),
        EXR_REQ_CHUNK_COUNT_STR,
        EXR_ATTR_INT,
        0,
        NULL,
        &(curpart->chunkCount));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'int'",
            EXR_REQ_CHUNK_COUNT_STR);

    attrsz                 = (int32_t) one_to_native32 ((uint32_t) attrsz);
    curpart->chunkCount->i = attrsz;
    curpart->chunk_count   = attrsz;
    return rv;
}